

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

int __thiscall Catch::Session::run<char>(Session *this,int argc,char **argv)

{
  Session *in_RDI;
  int returnCode;
  char **in_stack_00000168;
  int in_stack_00000174;
  Session *in_stack_00000178;
  int local_24;
  int local_4;
  
  if ((in_RDI->m_startupExceptions & 1U) == 0) {
    local_24 = applyCommandLine(in_stack_00000178,in_stack_00000174,in_stack_00000168);
    if (local_24 == 0) {
      local_24 = run(in_RDI);
    }
    local_4 = local_24;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int run(int argc, CharT const * const argv[]) {
            if (m_startupExceptions)
                return 1;
            int returnCode = applyCommandLine(argc, argv);
            if (returnCode == 0)
                returnCode = run();
            return returnCode;
        }